

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

int yy_comment(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *pcVar6;
  char *extraout_RDX_10;
  int yypos6;
  int yythunkpos6;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar4 = yymatchString(G,"#`[");
  pcVar6 = extraout_RDX;
  if (iVar4 != 0) {
    do {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yymatchClass(G,(uchar *)anon_var_dwarf_2d02,pcVar6);
      pcVar6 = extraout_RDX_00;
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar3;
    iVar4 = yymatchChar(G,0x5d);
    if (iVar4 != 0) {
      return 1;
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  iVar4 = yymatchString(G,"#`(");
  pcVar6 = extraout_RDX_01;
  if (iVar4 != 0) {
    do {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yymatchClass(G,(uchar *)anon_var_dwarf_462a,pcVar6);
      pcVar6 = extraout_RDX_02;
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar3;
    iVar4 = yymatchChar(G,0x29);
    if (iVar4 != 0) {
      return 1;
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  iVar4 = yymatchString(G,anon_var_dwarf_463e);
  pcVar6 = extraout_RDX_03;
  if (iVar4 != 0) {
    do {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yymatchClass(G,(uchar *)anon_var_dwarf_464a,pcVar6);
      pcVar6 = extraout_RDX_04;
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar3;
    iVar4 = yymatchString(G,anon_var_dwarf_465e);
    if (iVar4 != 0) {
      return 1;
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  iVar4 = yymatchString(G,anon_var_dwarf_466a);
  pcVar6 = extraout_RDX_05;
  if (iVar4 != 0) {
    do {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yymatchClass(G,(uchar *)anon_var_dwarf_4676,pcVar6);
      pcVar6 = extraout_RDX_06;
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar3;
    iVar4 = yymatchString(G,anon_var_dwarf_4682);
    if (iVar4 != 0) {
      return 1;
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  iVar4 = yymatchString(G,anon_var_dwarf_468e);
  pcVar6 = extraout_RDX_07;
  if (iVar4 != 0) {
    do {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yymatchClass(G,(uchar *)anon_var_dwarf_469a,pcVar6);
      pcVar6 = extraout_RDX_08;
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar3;
    iVar4 = yymatchString(G,anon_var_dwarf_46a6);
    if (iVar4 != 0) {
      return 1;
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  iVar4 = yymatchChar(G,0x23);
  pcVar6 = extraout_RDX_09;
  if (iVar4 != 0) {
    do {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yymatchClass(G,(uchar *)anon_var_dwarf_24ee,pcVar6);
      pcVar6 = extraout_RDX_10;
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar3;
    iVar4 = yy_end_of_line(G);
    if (iVar4 != 0) {
      return 1;
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_comment(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "comment"));

  {  int yypos6= G->pos, yythunkpos6= G->thunkpos;  if (!yymatchString(G, "#`[")) goto l7;

  l8:;	
  {  int yypos9= G->pos, yythunkpos9= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\377\377\377\377\377\377\337\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377", "^\\]")) goto l9;
  goto l8;
  l9:;	  G->pos= yypos9; G->thunkpos= yythunkpos9;
  }  if (!yymatchChar(G, ']')) goto l7;
  goto l6;
  l7:;	  G->pos= yypos6; G->thunkpos= yythunkpos6;  if (!yymatchString(G, "#`(")) goto l10;

  l11:;	
  {  int yypos12= G->pos, yythunkpos12= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\375\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377", "^)")) goto l12;
  goto l11;
  l12:;	  G->pos= yypos12; G->thunkpos= yythunkpos12;
  }  if (!yymatchChar(G, ')')) goto l10;
  goto l6;
  l10:;	  G->pos= yypos6; G->thunkpos= yythunkpos6;  if (!yymatchString(G, "#`（")) goto l13;

  l14:;	
  {  int yypos15= G->pos, yythunkpos15= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\375\377\377\377\377\377\357\377\377\377\377\377\177\377\377", "^\377\377\377")) goto l15;
  goto l14;
  l15:;	  G->pos= yypos15; G->thunkpos= yythunkpos15;
  }  if (!yymatchString(G, "）")) goto l13;
  goto l6;
  l13:;	  G->pos= yypos6; G->thunkpos= yythunkpos6;  if (!yymatchString(G, "#`『")) goto l16;

  l17:;	
  {  int yypos18= G->pos, yythunkpos18= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\376\177\377\377\377\377\377\377\377\377\377\377\367\377\377\377", "^\377\377\377")) goto l18;
  goto l17;
  l18:;	  G->pos= yypos18; G->thunkpos= yythunkpos18;
  }  if (!yymatchString(G, "』")) goto l16;
  goto l6;
  l16:;	  G->pos= yypos6; G->thunkpos= yythunkpos6;  if (!yymatchString(G, "#`《")) goto l19;

  l20:;	
  {  int yypos21= G->pos, yythunkpos21= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\376\367\377\377\377\377\377\377\377\377\377\377\367\377\377\377", "^\377\377\377")) goto l21;
  goto l20;
  l21:;	  G->pos= yypos21; G->thunkpos= yythunkpos21;
  }  if (!yymatchString(G, "》")) goto l19;
  goto l6;
  l19:;	  G->pos= yypos6; G->thunkpos= yythunkpos6;  if (!yymatchChar(G, '#')) goto l5;

  l22:;	
  {  int yypos23= G->pos, yythunkpos23= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\373\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377", "^\\n")) goto l23;
  goto l22;
  l23:;	  G->pos= yypos23; G->thunkpos= yythunkpos23;
  }  if (!yy_end_of_line(G))  goto l5;

  }
  l6:;	  yyprintf((stderr, "  ok   comment"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l5:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "comment"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}